

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjunittest.c
# Opt level: O2

int cmpBitmap(uchar *buf,int width,int pitch,int height,int pf,int flags,int gray2rgb)

{
  char cVar1;
  byte bVar4;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  char cVar10;
  byte bVar11;
  byte bVar12;
  short sVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  byte bVar19;
  ulong uVar20;
  byte *pbVar21;
  byte bVar22;
  short sVar23;
  int iVar24;
  double dVar25;
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [11];
  undefined1 auVar33 [16];
  char cVar2;
  char cVar3;
  byte bVar5;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar31 [12];
  undefined1 auVar37 [16];
  undefined1 auVar32 [13];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar39 [16];
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  
  lVar17 = (long)pitch;
  iVar14 = 0;
  do {
    if (iVar14 == 0x27) {
      return 1;
    }
    iVar18 = 0x26 - iVar14;
    if ((height & 2U) == 0) {
      iVar18 = iVar14;
    }
    bVar11 = (byte)((ulong)(uint)(iVar14 << 8) / 0x27);
    pbVar21 = buf + iVar18 * width;
    iVar18 = iVar18 * width + tjAlphaOffset[lVar17];
    for (uVar20 = 0; uVar20 != 0x2300; uVar20 = uVar20 + 0x100) {
      uVar15 = uVar20 & 0xffffffff;
      uVar16 = (ushort)uVar15 / 0x23;
      bVar12 = (byte)uVar16;
      bVar19 = bVar12 + bVar11;
      if (pitch == 0xb) {
        dVar25 = (double)pbVar21[3];
        auVar26._0_8_ = dVar25 * (double)pbVar21[2];
        auVar26._8_8_ = dVar25 * (double)*pbVar21;
        auVar26 = divpd(auVar26,_DAT_00157030);
        iVar24 = (int)(auVar26._0_8_ + 0.5);
        iVar29 = (int)(auVar26._8_8_ + 0.5);
        sVar6 = (short)iVar24;
        cVar1 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar24 - (0xff < sVar6);
        sVar7 = (short)((uint)iVar24 >> 0x10);
        cVar10 = (char)((uint)iVar24 >> 0x10);
        sVar23 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar10 - (0xff < sVar7),cVar1);
        sVar8 = (short)iVar29;
        cVar2 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar29 - (0xff < sVar8);
        sVar9 = (short)((uint)iVar29 >> 0x10);
        cVar44 = (char)((uint)iVar29 >> 0x10);
        cVar3 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar24 - (0xff < sVar6);
        sVar13 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar10 - (0xff < sVar7),cVar3);
        cVar10 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar29 - (0xff < sVar8);
        bVar4 = (0 < sVar23) * (sVar23 < 0x100) * cVar1 - (0xff < sVar23);
        sVar6 = (short)(CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar44 - (0xff < sVar9),
                                 CONCAT12(cVar2,sVar23)) >> 0x10);
        bVar5 = (0 < sVar6) * (sVar6 < 0x100) * cVar2 - (0xff < sVar6);
        auVar27[1] = bVar5;
        auVar27[0] = bVar4;
        auVar27._2_2_ = 0;
        cVar43 = (0 < sVar13) * (sVar13 < 0x100) * cVar3 - (0xff < sVar13);
        auVar27[4] = cVar43;
        sVar7 = (short)(CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar44 - (0xff < sVar9),
                                 CONCAT12(cVar10,sVar13)) >> 0x10);
        cVar44 = (0 < sVar7) * (sVar7 < 0x100) * cVar10 - (0xff < sVar7);
        auVar27[5] = cVar44;
        auVar27._6_2_ = 0;
        cVar1 = (0 < sVar23) * (sVar23 < 0x100) * cVar1 - (0xff < sVar23);
        auVar27[8] = cVar1;
        cVar2 = (0 < sVar6) * (sVar6 < 0x100) * cVar2 - (0xff < sVar6);
        auVar27[9] = cVar2;
        auVar27._10_2_ = 0;
        cVar3 = (0 < sVar13) * (sVar13 < 0x100) * cVar3 - (0xff < sVar13);
        auVar27[0xc] = cVar3;
        cVar10 = (0 < sVar7) * (sVar7 < 0x100) * cVar10 - (0xff < sVar7);
        auVar27[0xd] = cVar10;
        auVar27._14_2_ = 0;
        bVar22 = (byte)(int)(((double)pbVar21[1] * dVar25) / 255.0 + 0.5);
        if (pf == 0) {
          auVar33[0] = -(bVar19 == bVar4);
          cVar41 = -((char)(uVar16 >> 8) == '\0');
          cVar42 = -((char)(uVar15 >> 0x10) == '\0');
          cVar43 = -(cVar43 == '\0');
          cVar44 = -(cVar44 == '\0');
          auVar35._0_9_ = CONCAT18(-(cVar1 == '\0'),0xff00000000000000);
          auVar30._0_10_ = CONCAT19(-(cVar2 == '\0'),auVar35._0_9_);
          auVar30[10] = 0xff;
          auVar31[0xb] = 0xff;
          auVar31._0_11_ = auVar30;
          auVar32[0xc] = -(cVar3 == '\0');
          auVar32._0_12_ = auVar31;
          auVar40[0xd] = -(cVar10 == '\0');
          auVar40._0_13_ = auVar32;
          auVar40[0xe] = 0xff;
          auVar40[0xf] = 0xff;
          auVar39._14_2_ = auVar40._14_2_;
          auVar39[0xd] = 0xff;
          auVar39._0_13_ = auVar32;
          auVar38._13_3_ = auVar39._13_3_;
          auVar38[0xc] = 0xff;
          auVar38._0_12_ = auVar31;
          auVar37._12_4_ = auVar38._12_4_;
          auVar37[0xb] = cVar44;
          auVar37._0_11_ = auVar30;
          auVar36._11_5_ = auVar37._11_5_;
          auVar36[10] = cVar44;
          auVar36._0_10_ = auVar30._0_10_;
          auVar35._10_6_ = auVar36._10_6_;
          auVar35[9] = cVar43;
          auVar34._9_7_ = auVar35._9_7_;
          auVar34[8] = cVar43;
          auVar34._0_8_ = 0xff00000000000000;
          auVar33._8_8_ = auVar34._8_8_;
          auVar33[7] = cVar42;
          auVar33[6] = cVar42;
          auVar33[5] = cVar41;
          auVar33[4] = cVar41;
          auVar33[3] = -(bVar12 == bVar5);
          auVar33[2] = -(bVar12 == bVar5);
          auVar33[1] = auVar33[0];
          auVar26 = pshuflw(auVar27,auVar33,0x50);
          auVar28._0_4_ = auVar26._0_4_;
          auVar28._4_4_ = auVar28._0_4_;
          auVar28._8_4_ = auVar26._4_4_;
          auVar28._12_4_ = auVar26._4_4_;
          uVar16 = movmskpd((int)CONCAT62((int6)(uVar15 >> 0x10),(short)uVar16) << 8,auVar28);
          if ((uVar16 & 2) == 0) {
            return 0;
          }
          if (bVar22 != bVar11) {
            return 0;
          }
          if ((uVar16 & 1) == 0) {
            return 0;
          }
        }
        else {
          if (bVar5 != bVar19) {
            return 0;
          }
          if (bVar22 != bVar19) {
            return 0;
          }
          if (bVar4 != bVar19) {
            return 0;
          }
        }
      }
      else if (pitch == 6) {
        if (*pbVar21 != bVar19) {
          return 0;
        }
      }
      else {
        if (pf == 0) {
          if (pbVar21[tjRedOffset[lVar17]] != bVar12) {
            return 0;
          }
          if (pbVar21[tjGreenOffset[lVar17]] != bVar11) {
            return 0;
          }
        }
        else {
          if (pbVar21[tjRedOffset[lVar17]] != bVar19) {
            return 0;
          }
          if (pbVar21[tjGreenOffset[lVar17]] != bVar19) {
            return 0;
          }
        }
        if (pbVar21[tjBlueOffset[lVar17]] != bVar19) {
          return 0;
        }
        if ((lVar17 - 7U < 4) && (buf[iVar18] != 0xff)) {
          return 0;
        }
      }
      iVar18 = iVar18 + tjPixelSize[lVar17];
      pbVar21 = pbVar21 + tjPixelSize[lVar17];
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

static int cmpBitmap(unsigned char *buf, int width, int pitch, int height,
                     int pf, int flags, int gray2rgb)
{
  int roffset = tjRedOffset[pf];
  int goffset = tjGreenOffset[pf];
  int boffset = tjBlueOffset[pf];
  int aoffset = tjAlphaOffset[pf];
  int ps = tjPixelSize[pf];
  int i, j;

  for (j = 0; j < height; j++) {
    int row = (flags & TJFLAG_BOTTOMUP) ? height - j - 1 : j;

    for (i = 0; i < width; i++) {
      unsigned char r = (i * 256 / width) % 256;
      unsigned char g = (j * 256 / height) % 256;
      unsigned char b = (j * 256 / height + i * 256 / width) % 256;

      if (pf == TJPF_GRAY) {
        if (buf[row * pitch + i * ps] != b)
          return 0;
      } else if (pf == TJPF_CMYK) {
        unsigned char rf, gf, bf;

        cmyk_to_rgb(buf[row * pitch + i * ps + 0],
                    buf[row * pitch + i * ps + 1],
                    buf[row * pitch + i * ps + 2],
                    buf[row * pitch + i * ps + 3], &rf, &gf, &bf);
        if (gray2rgb) {
          if (rf != b || gf != b || bf != b)
            return 0;
        } else if (rf != r || gf != g || bf != b) return 0;
      } else {
        if (gray2rgb) {
          if (buf[row * pitch + i * ps + roffset] != b ||
              buf[row * pitch + i * ps + goffset] != b ||
              buf[row * pitch + i * ps + boffset] != b)
            return 0;
        } else if (buf[row * pitch + i * ps + roffset] != r ||
                   buf[row * pitch + i * ps + goffset] != g ||
                   buf[row * pitch + i * ps + boffset] != b)
          return 0;
        if (aoffset >= 0 && buf[row * pitch + i * ps + aoffset] != 0xFF)
          return 0;
      }
    }
  }
  return 1;
}